

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

void __thiscall
fasttext::DenseMatrix::addVectorToRow(DenseMatrix *this,Vector *vec,int64_t i,real a)

{
  pointer pfVar1;
  pointer pfVar2;
  undefined1 auVar3 [16];
  uint __line;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  char *__assertion;
  undefined1 in_register_00001204 [12];
  
  if (i < 0) {
    __assertion = "i >= 0";
    __line = 0x7b;
  }
  else if (i < (this->super_Matrix).m_) {
    pfVar1 = (vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar1;
    uVar5 = lVar4 >> 2;
    if (uVar5 == (this->super_Matrix).n_) {
      pfVar2 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar6 = 0; (~(lVar4 >> 0x3f) & uVar5) != uVar6; uVar6 = uVar6 + 1) {
        auVar3._4_12_ = in_register_00001204;
        auVar3._0_4_ = a;
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)pfVar1[uVar6]),auVar3,
                                 ZEXT416((uint)pfVar2[i * uVar5 + uVar6]));
        pfVar2[i * uVar5 + uVar6] = auVar3._0_4_;
      }
      return;
    }
    __assertion = "vec.size() == n_";
    __line = 0x7d;
  }
  else {
    __assertion = "i < m_";
    __line = 0x7c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                ,__line,
                "virtual void fasttext::DenseMatrix::addVectorToRow(const Vector &, int64_t, real)")
  ;
}

Assistant:

void DenseMatrix::addVectorToRow(const Vector& vec, int64_t i, real a) {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  for (int64_t j = 0; j < n_; j++) {
    data_[i * n_ + j] += a * vec[j];
  }
}